

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O2

int pbkdf2_sha1(char *pw,size_t pw_len,uint8_t *salt,size_t salt_len,uint rounds,
               uint8_t *derived_key,size_t derived_key_len)

{
  return -1;
}

Assistant:

static int
pbkdf2_sha1(const char *pw, size_t pw_len, const uint8_t *salt,
    size_t salt_len, unsigned rounds, uint8_t *derived_key,
    size_t derived_key_len) {
	(void)pw; /* UNUSED */
	(void)pw_len; /* UNUSED */
	(void)salt; /* UNUSED */
	(void)salt_len; /* UNUSED */
	(void)rounds; /* UNUSED */
	(void)derived_key; /* UNUSED */
	(void)derived_key_len; /* UNUSED */
	return -1; /* UNSUPPORTED */
}